

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ImmediateAssertionStatementSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == ImmediateAssertStatement) ||
     (kind == ImmediateAssumeStatement || kind == ImmediateCoverStatement)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImmediateAssertionStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
            return true;
        default:
            return false;
    }
}